

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_private.hpp
# Opt level: O1

bool __thiscall
Infector::Container::tryToGetSize<BadClassVS,GoodClassVS,Infector::DummyClass>
          (Container *this,RecursionLimit *limit,int *size)

{
  mapped_type mVar1;
  bool bVar2;
  byte bVar3;
  iterator iVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  key_type local_40;
  int *local_38;
  
  local_40._M_target = (type_info *)&BadClassVS::typeinfo;
  iVar4 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->typeMap)._M_h,&local_40);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
      ._M_cur != (__node_type *)0x0) {
    iVar5 = std::
            _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->recursionMap)._M_h,
                   (key_type *)
                   ((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                          ._M_cur + 0x10));
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      bVar2 = tryToGetSize<GoodClassVS,Infector::DummyClass>(this,limit,size);
      *size = *size + 1;
      RecursionLimit::increment(limit);
      local_40._M_target = (type_info *)limit;
      local_38 = size;
      if (*(long *)((long)iVar5.
                          super__Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
                          ._M_cur + 0x20) == 0) {
        std::__throw_bad_function_call();
      }
      bVar3 = (**(code **)((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
                                 ._M_cur + 0x28))
                        ((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
                               ._M_cur + 0x10,&local_40,&local_38);
      RecursionLimit::decrement(limit);
      local_40._M_target =
           ((key_type *)
           ((long)iVar4.
                  super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                  ._M_cur + 0x10))->_M_target;
      mVar1 = *size;
      if ((bool)(bVar2 & bVar3) != true) {
        return (bool)(bVar2 & bVar3);
      }
      pmVar6 = std::__detail::
               _Map_base<std::type_index,_std::pair<const_std::type_index,_int>,_std::allocator<std::pair<const_std::type_index,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_int>,_std::allocator<std::pair<const_std::type_index,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->typeInfoMap,&local_40);
      *pmVar6 = mVar1;
      return true;
    }
  }
  return false;
}

Assistant:

bool Container::tryToGetSize( RecursionLimit *limit, int *size){
        //get abstract type
        auto it = typeMap.find( std::type_index(typeid(Actual)) );
        if( it==typeMap.end())
            return false; //abstract type not registered

        auto it2 = recursionMap.find(  it->second.type ); //get concrete funct
        if( it2==recursionMap.end())
            return false; // concrete functor not created yet..

        bool horizontalExpansion = tryToGetSize<Next,Others...>(limit,size);

        (*size)+= sizeof(Actual);
        (*limit).increment();
        bool recursiveExpansion = (it2->second)(limit,size);
        (*limit).decrement();

        bool result = true&&horizontalExpansion&&recursiveExpansion;
        setKnownSizeForType(it->second.type, result, (*size));
        return result;
    }